

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  GLFWwindow *pGVar3;
  int local_58;
  int local_54;
  int bottom;
  int right;
  int top;
  int left;
  GLFWwindow *windows [4];
  uint local_1c;
  GLboolean running;
  int i;
  char **argv_local;
  int argc_local;
  
  bVar1 = true;
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  glfwWindowHint(0x20005,0);
  glfwWindowHint(0x20004,0);
  local_1c = 0;
  while( true ) {
    if (3 < (int)local_1c) {
      for (local_1c = 0; (int)local_1c < 4; local_1c = local_1c + 1) {
        glfwShowWindow(*(GLFWwindow **)(&top + (long)(int)local_1c * 2));
      }
      while (bVar1) {
        for (local_1c = 0; (int)local_1c < 4; local_1c = local_1c + 1) {
          glfwMakeContextCurrent(*(GLFWwindow **)(&top + (long)(int)local_1c * 2));
          glClear(0x4000);
          glfwSwapBuffers(*(GLFWwindow **)(&top + (long)(int)local_1c * 2));
          iVar2 = glfwWindowShouldClose(*(GLFWwindow **)(&top + (long)(int)local_1c * 2));
          if (iVar2 != 0) {
            bVar1 = false;
          }
        }
        glfwPollEvents();
      }
      glfwTerminate();
      exit(0);
    }
    pGVar3 = glfwCreateWindow(200,200,titles[(int)local_1c],(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    *(GLFWwindow **)(&top + (long)(int)local_1c * 2) = pGVar3;
    if (*(long *)(&top + (long)(int)local_1c * 2) == 0) break;
    glfwSetKeyCallback(*(GLFWwindow **)(&top + (long)(int)local_1c * 2),key_callback);
    glfwMakeContextCurrent(*(GLFWwindow **)(&top + (long)(int)local_1c * 2));
    glClearColor(colors[(int)local_1c].r,colors[(int)local_1c].g,colors[(int)local_1c].b,0x3f800000)
    ;
    glfwGetWindowFrameSize
              (*(GLFWwindow **)(&top + (long)(int)local_1c * 2),&right,&bottom,&local_54,&local_58);
    glfwSetWindowPos(*(GLFWwindow **)(&top + (long)(int)local_1c * 2),
                     (local_1c & 1) * (right + 200 + local_54) + 100,
                     ((int)local_1c >> 1) * (bottom + 200 + local_58) + 100);
    local_1c = local_1c + 1;
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    GLboolean running = GL_TRUE;
    GLFWwindow* windows[4];

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_DECORATED, GL_FALSE);
    glfwWindowHint(GLFW_VISIBLE, GL_FALSE);

    for (i = 0;  i < 4;  i++)
    {
        int left, top, right, bottom;

        windows[i] = glfwCreateWindow(200, 200, titles[i], NULL, NULL);
        if (!windows[i])
        {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwSetKeyCallback(windows[i], key_callback);

        glfwMakeContextCurrent(windows[i]);
        glClearColor(colors[i].r, colors[i].g, colors[i].b, 1.f);

        glfwGetWindowFrameSize(windows[i], &left, &top, &right, &bottom);
        glfwSetWindowPos(windows[i],
                         100 + (i & 1) * (200 + left + right),
                         100 + (i >> 1) * (200 + top + bottom));
    }

    for (i = 0;  i < 4;  i++)
        glfwShowWindow(windows[i]);

    while (running)
    {
        for (i = 0;  i < 4;  i++)
        {
            glfwMakeContextCurrent(windows[i]);
            glClear(GL_COLOR_BUFFER_BIT);
            glfwSwapBuffers(windows[i]);

            if (glfwWindowShouldClose(windows[i]))
                running = GL_FALSE;
        }

        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}